

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::setKernelArg
          (CLIntercept *this,cl_kernel kernel,cl_uint arg_index,void *arg_value,size_t arg_size)

{
  pointer pcVar1;
  bool bVar2;
  iterator iVar3;
  mapped_type *this_00;
  mapped_type *ppvVar4;
  mapped_type *this_01;
  mapped_type *pmVar5;
  mapped_type *this_02;
  mapped_type *pmVar6;
  mapped_type *this_03;
  mapped_type_conflict *pmVar7;
  string samplerString;
  cl_uint local_70;
  allocator_type local_69;
  cl_kernel local_68;
  string local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  local_70 = arg_index;
  local_68 = kernel;
  std::mutex::lock(&this->m_Mutex);
  if (arg_value == (void *)0x0) {
    this_03 = std::
              map<_cl_kernel_*,_std::map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>_>_>_>
              ::operator[](&this->m_KernelArgLocalSizeMap,&local_68);
    pmVar7 = std::
             map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
             ::operator[](this_03,&local_70);
    *pmVar7 = arg_size;
  }
  else {
    if (arg_size == 8) {
      pcVar1 = *arg_value;
      local_60._M_dataplus._M_p = pcVar1;
      iVar3 = std::
              _Rb_tree<const_void_*,_std::pair<const_void_*const,_unsigned_int>,_std::_Select1st<std::pair<const_void_*const,_unsigned_int>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
              ::find(&(this->m_MemAllocNumberMap)._M_t,(key_type *)&local_60);
      if ((_Rb_tree_header *)iVar3._M_node !=
          &(this->m_MemAllocNumberMap)._M_t._M_impl.super__Rb_tree_header) {
        this_00 = std::
                  map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
                  ::operator[](&this->m_KernelArgMemMap,&local_68);
        ppvVar4 = std::
                  map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
                  ::operator[](this_00,&local_70);
        *ppvVar4 = pcVar1;
      }
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    bVar2 = checkGetSamplerString(this,arg_size,arg_value,&local_60);
    if (bVar2) {
      this_01 = std::
                map<_cl_kernel_*,_std::map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                ::operator[](&this->m_KernelArgSamplerMap,&local_68);
      pmVar5 = std::
               map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_01,&local_70);
      std::__cxx11::string::_M_assign((string *)pmVar5);
    }
    this_02 = std::
              map<_cl_kernel_*,_std::map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
              ::operator[](&this->m_KernelArgDataMap,&local_68);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_40,(uchar *)arg_value,
               (uchar *)(arg_size + (long)arg_value),&local_69);
    pmVar6 = std::
             map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::operator[](this_02,&local_70);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(pmVar6,&local_40);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::setKernelArg(
    cl_kernel kernel,
    cl_uint arg_index,
    const void* arg_value,
    size_t arg_size )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    if( arg_value != nullptr )
    {
        if( arg_size == sizeof(cl_mem) )
        {
            cl_mem  mem = ((cl_mem*)arg_value)[0];
            if( m_MemAllocNumberMap.find(mem) != m_MemAllocNumberMap.end() )
            {
                CArgMemMap& argMemMap = m_KernelArgMemMap[ kernel ];
                argMemMap[ arg_index ] = mem;
            }
        }

        std::string samplerString;
        if( checkGetSamplerString( arg_size, arg_value, samplerString) )
        {
            CArgSamplerMap& argSamplerMap = m_KernelArgSamplerMap[kernel];
            argSamplerMap[ arg_index ] = samplerString;
        }

        CArgDataMap& argDataMap = m_KernelArgDataMap[kernel];
        const uint8_t* pRawArgData = reinterpret_cast<const uint8_t*>(arg_value);
        argDataMap[ arg_index ] = std::vector<uint8_t>(
            pRawArgData, pRawArgData + arg_size );
    }
    else
    {
        CArgLocalSizeMap& argMap = m_KernelArgLocalSizeMap[ kernel ];
        argMap[ arg_index ] = arg_size;
    }
}